

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Ublox.cpp
# Opt level: O2

int __thiscall
UBXParser::decodeMessage(UBXParser *this,vector<double,_std::allocator<double>_> *data)

{
  uint uVar1;
  uint uVar2;
  uchar *puVar3;
  pointer pdVar4;
  int iVar5;
  int iVar6;
  ushort uVar7;
  uchar uVar8;
  uint i;
  ulong uVar9;
  uchar uVar10;
  long lVar11;
  double local_28;
  
  puVar3 = this->message;
  uVar1 = this->scanner->message_length;
  this->length = uVar1;
  uVar2 = this->scanner->position;
  this->position = uVar2;
  lVar11 = (long)(int)(uVar2 - uVar1);
  uVar8 = '\0';
  uVar10 = '\0';
  for (uVar9 = 2; uVar9 < uVar1 - 2; uVar9 = uVar9 + 1) {
    uVar8 = uVar8 + puVar3[uVar9 + lVar11];
    uVar10 = uVar10 + uVar8;
  }
  iVar5 = 0;
  iVar6 = 0;
  if ((((uVar10 == puVar3[(ulong)uVar1 + lVar11 + -1]) &&
       (iVar6 = 0, uVar8 == puVar3[(ulong)uVar1 + lVar11 + -2])) &&
      (iVar6 = iVar5, puVar3[lVar11 + 1] == 'b')) && (puVar3[lVar11] == 0xb5)) {
    uVar7 = *(ushort *)(puVar3 + lVar11 + 2) << 8 | *(ushort *)(puVar3 + lVar11 + 2) >> 8;
    if (uVar7 == 0x120) {
      pdVar4 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish != pdVar4) {
        (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = pdVar4;
      }
      local_28 = (double)*(uint *)(puVar3 + lVar11 + 6);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      local_28 = (double)*(int *)(this->message + lVar11 + 10);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      local_28 = (double)this->message[lVar11 + 0xe];
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      local_28 = (double)this->message[lVar11 + 0x10];
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      iVar6 = 0x120;
    }
    else if (uVar7 == 0x103) {
      pdVar4 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish != pdVar4) {
        (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = pdVar4;
      }
      local_28 = (double)puVar3[lVar11 + 10];
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      local_28 = (double)this->message[lVar11 + 0xb];
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      iVar6 = 0x103;
    }
    else if (uVar7 == 0x102) {
      pdVar4 = (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
               super__Vector_impl_data._M_start;
      if ((data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
          super__Vector_impl_data._M_finish != pdVar4) {
        (data->super__Vector_base<double,_std::allocator<double>_>)._M_impl.super__Vector_impl_data.
        _M_finish = pdVar4;
      }
      local_28 = (double)*(uint *)(puVar3 + lVar11 + 6);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      local_28 = (double)*(int *)(this->message + lVar11 + 10);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      local_28 = (double)*(int *)(this->message + lVar11 + 0xe);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      local_28 = (double)*(int *)(this->message + lVar11 + 0x12);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      local_28 = (double)*(int *)(this->message + lVar11 + 0x16);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      local_28 = (double)*(uint *)(this->message + lVar11 + 0x1a);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      local_28 = (double)*(uint *)(this->message + lVar11 + 0x1e);
      std::vector<double,_std::allocator<double>_>::emplace_back<double>(data,&local_28);
      iVar6 = 0x102;
    }
  }
  return iVar6;
}

Assistant:

int UBXParser::decodeMessage(std::vector<double>& data)
{
    int flag=1;
    int pos;
    uint16_t id;
    uint8_t CK_A=0, CK_B=0;

    updateMessageData(); // get the length and end message coordinate from UBX scanner

    pos = position-length; // count the message start position

    // All UBX messages start with 2 sync chars: 0xb5 and 0x62

    if (*(message+pos)!=0xb5) flag=0;
    if (*(message+pos+1)!=0x62) flag=0;

    // Count the checksum

    for (unsigned int i=2;i<(length-2);i++){
        CK_A += *(message+pos+i);
        CK_B += CK_A;
    }

    if (CK_A != *(message+pos+length-2)) flag=0;
    if (CK_B != *(message+pos+length-1)) flag=0;

    // If the sync chars, or the checksum is wrong, we should not be doing this anymore

    if (flag==0) return 0;

    // If we got everything right, then it's time to decide, what type of message this is

    id = (*(message+pos+2)) << 8 | (*(message+pos+3)); // ID is a two-byte number with little endianness

    flag = id; // will return message id, if we got the info decoded

    switch(id){
        case 258:
                // ID for Nav-Posllh messages is 0x0102 == 258
                // In this example we extract 7 variables - longitude, latitude,
                // height above ellipsoid and mean sea level, horizontal and vertical
                // accuracy estimate and iTOW - GPS Millisecond Time of Week

                // All the needed parameters are 4-byte numbers with little endianness.
                // We know the current message and we want to update the info in the data vector.
                // First we clear the old data:

                data.clear();

                // Second, we extract the needed data from the message buffer and save it to the vector.

                //iTOW
                data.push_back ((unsigned)((*(message+pos+9) << 24) | (*(message+pos+8) << 16) | (*(message+pos+7) << 8) | (*(message+pos+6))));
                //Longitude
                data.push_back ((*(message+pos+13) << 24) | (*(message+pos+12) << 16) | (*(message+pos+11) << 8) | (*(message+pos+10)));
                //Latitude
                data.push_back ((*(message+pos+17) << 24) | (*(message+pos+16) << 16) | (*(message+pos+15) << 8) | (*(message+pos+14)));
                //Height above Ellipsoid
                data.push_back ((*(message+pos+21) << 24) | (*(message+pos+20) << 16) | (*(message+pos+19) << 8) | (*(message+pos+18)));
                //Height above mean sea level
                data.push_back ((*(message+pos+25) << 24) | (*(message+pos+24) << 16) | (*(message+pos+23) << 8) | (*(message+pos+22)));
                //Horizontal Accuracy Estateimate
                data.push_back ((unsigned)((*(message+pos+29) << 24) | (*(message+pos+28) << 16) | (*(message+pos+27) << 8) | (*(message+pos+26))));
                //Vertical Accuracy Estateimate
                data.push_back ((unsigned)((*(message+pos+33) << 24) | (*(message+pos+32) << 16) | (*(message+pos+31) << 8) | (*(message+pos+30))));
                break;

        case 259:
                // ID for Nav-Status messages is 0x0103 == 259
                // This message contains a lot of information, but the reason we use it the GPS fix status
                // This status is a one byte flag variable, with the offset of 10: first 6 bytes of the captured
                // message contain message header, id, payload length, next 4 are the first payload variable - iTOW.
                // We are not interested in it, so we just proceed to the fifth byte - gpsFix flag.
                // We are also interested in checking the gpsFixOk flag in the next byte/
                data.clear();
                // gpsFix
                data.push_back (*(message+pos+10));
                // flags, which contain gpsFixOk
                data.push_back (*(message+pos+11));

                break;

        case 288:
                // ID for Nav-TIMEGPS messages is 0x0120 == 288
                // The message starts with an offset of 10: first 6 bytes of the captured
                // message contain message header, id, payload length
                // This message contains information on time reference. Here we are interested in iTOW (offset 6), fTOW (offset 10), week number (offset 14)
                // and leap seconds (offset 16).
                data.clear();
                //iTOW
                data.push_back ((unsigned)((*(message+pos+9) << 24) | (*(message+pos+8) << 16) | (*(message+pos+7) << 8) | (*(message+pos+6))));
                //fTOW
                data.push_back ((*(message+pos+13) << 24) | (*(message+pos+12) << 16) | (*(message+pos+11) << 8) | (*(message+pos+10)));
                // Week
                data.push_back (*(message+pos+6+8));    // 6 header bytes + 8 offset
                // Leap seconds
                data.push_back (*(message+pos+6+10));   // 6 header bytes + 10 offset
                break;

        default:
                // In case we don't want to decode the received message
                flag = 0;

                break;
    }

    return flag;
}